

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

void __thiscall Am_Web_Data::Clear_Changed(Am_Web_Data *this)

{
  Input_Port *pIVar1;
  Input_Port *pIVar2;
  
  pIVar2 = this->changed_first;
  while (pIVar2 != (Input_Port *)0x0) {
    pIVar1 = pIVar2->next_changed;
    Am_Value::operator=(&pIVar2->prev_value,&Am_No_Value);
    pIVar2->changed = false;
    pIVar2->next_changed = (Input_Port *)0x0;
    pIVar2->prev_changed = (Input_Port *)0x0;
    pIVar2 = pIVar1;
  }
  this->changed_first = (Input_Port *)0x0;
  this->changed_last = (Input_Port *)0x0;
  return;
}

Assistant:

void
Am_Web_Data::Clear_Changed()
{
  Input_Port *curr = changed_first;
  Input_Port *next;
  while (curr) {
    next = curr->next_changed;
    curr->prev_value = Am_No_Value;
    curr->changed = false;
    curr->next_changed = nullptr;
    curr->prev_changed = nullptr;
    curr = next;
  }
  changed_first = nullptr;
  changed_last = nullptr;
}